

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O0

ON_wStringHeader * __thiscall ON_wString::Header(ON_wString *this)

{
  ON_Internal_Empty_wString *local_18;
  ON_wStringHeader *hdr;
  ON_wString *this_local;
  
  if (this->m_s == (wchar_t *)0x0) {
    local_18 = &empty_wstring;
  }
  else {
    local_18 = (ON_Internal_Empty_wString *)(this->m_s + -3);
  }
  return &local_18->header;
}

Assistant:

ON_wStringHeader* ON_wString::Header() const
{
  ON_wStringHeader* hdr = (ON_wStringHeader*)m_s;
  if (hdr)
    hdr--;
  else
    hdr = &empty_wstring.header;
  return hdr;
}